

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O3

_Bool al_install_haptic(void)

{
  _func_ALLEGRO_HAPTIC_DRIVER_ptr *p_Var1;
  _Bool _Var2;
  ALLEGRO_SYSTEM *pAVar3;
  ALLEGRO_HAPTIC_DRIVER *pAVar4;
  
  _Var2 = true;
  if (haptic_driver == (ALLEGRO_HAPTIC_DRIVER *)0x0) {
    pAVar3 = al_get_system_driver();
    p_Var1 = pAVar3->vt->get_haptic_driver;
    if (((p_Var1 != (_func_ALLEGRO_HAPTIC_DRIVER_ptr *)0x0) &&
        (pAVar4 = (*p_Var1)(), pAVar4 != (ALLEGRO_HAPTIC_DRIVER *)0x0)) &&
       (_Var2 = (*pAVar4->init_haptic)(), _Var2)) {
      haptic_driver = pAVar4;
      _al_add_exit_func(al_uninstall_haptic,"al_uninstall_haptic");
      return true;
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool al_install_haptic(void)
{
   ALLEGRO_SYSTEM *sysdrv;
   ALLEGRO_HAPTIC_DRIVER *hapdrv;

   if (haptic_driver)
      return true;

   sysdrv = al_get_system_driver();
   ASSERT(sysdrv);

   /* Currently every platform only has at most one haptic driver. */
   if (sysdrv->vt->get_haptic_driver) {
      hapdrv = sysdrv->vt->get_haptic_driver();
      /* Avoid race condition in case the haptic driver generates an
       * event right after ->init_haptic.
       */
      if (hapdrv && hapdrv->init_haptic()) {
         haptic_driver = hapdrv;
         _al_add_exit_func(al_uninstall_haptic, "al_uninstall_haptic");
         return true;
      }
   }

   return false;
}